

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  int64_t iVar5;
  void *pvVar6;
  long lVar7;
  int64_t iVar8;
  void *pvVar9;
  int iVar10;
  wchar_t wVar11;
  size_t min;
  
  wVar11 = L'\xffffffff';
  if (best_bid < L'!') {
    pvVar3 = a->format->data;
    uVar4 = __archive_read_seek(a,0,2);
    wVar11 = L'\0';
    if (0 < (long)uVar4) {
      min = 0x4000;
      if (uVar4 < 0x4000) {
        min = uVar4;
      }
      iVar5 = __archive_read_seek(a,(long)-(int)min,2);
      wVar11 = L'\0';
      if (-1 < iVar5) {
        wVar11 = L'\0';
        pvVar6 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if ((pvVar6 != (void *)0x0) && (0x15 < uVar4)) {
          iVar10 = 0;
          do {
            lVar7 = (long)iVar10;
            bVar1 = *(byte *)((long)pvVar6 + lVar7 + 3);
            if (bVar1 < 7) {
              if (bVar1 != 5) {
                if (bVar1 != 6) goto LAB_0042169e;
                if ((((*(int *)((long)pvVar6 + lVar7) == 0x6054b50) &&
                     (*(short *)((long)pvVar6 + lVar7 + 4) == 0)) &&
                    (*(short *)((long)pvVar6 + lVar7 + 6) == 0)) &&
                   ((*(short *)((long)pvVar6 + lVar7 + 10) == *(short *)((long)pvVar6 + lVar7 + 8)
                    && (uVar2 = *(uint *)((long)pvVar6 + lVar7 + 0x10), uVar4 = (ulong)uVar2,
                       (long)(ulong)(*(int *)((long)pvVar6 + lVar7 + 0xc) + uVar2) <= iVar5 + lVar7)
                    ))) goto LAB_004216cd;
              }
              iVar10 = iVar10 + 1;
            }
            else if (bVar1 == 7) {
              if (((((*(int *)((long)pvVar6 + lVar7) == 0x7064b50) &&
                    (*(int *)((long)pvVar6 + lVar7 + 4) == 0)) &&
                   ((*(int *)((long)pvVar6 + lVar7 + 0x10) == 1 &&
                    ((((iVar8 = __archive_read_seek(a,*(int64_t *)((long)pvVar6 + lVar7 + 8),0),
                       -1 < iVar8 &&
                       (pvVar9 = __archive_read_ahead(a,0x38,(ssize_t *)0x0), pvVar9 != (void *)0x0)
                       ) && (0xffffffffffffc036 < *(long *)((long)pvVar9 + 4) - 0x3ff5U)) &&
                     ((pvVar9 = __archive_read_ahead
                                          (a,*(long *)((long)pvVar9 + 4) + 0xc,(ssize_t *)0x0),
                      pvVar9 != (void *)0x0 && (*(int *)((long)pvVar9 + 0x10) == 0)))))))) &&
                  (*(int *)((long)pvVar9 + 0x14) == 0)) &&
                 (*(long *)((long)pvVar9 + 0x18) == *(long *)((long)pvVar9 + 0x20))) {
                uVar4 = *(ulong *)((long)pvVar9 + 0x30);
LAB_004216cd:
                *(ulong *)((long)pvVar3 + 0x40) = uVar4;
                return L' ';
              }
LAB_0042169e:
              iVar10 = iVar10 + 4;
            }
            else if (bVar1 == 0x50) {
              iVar10 = iVar10 + 3;
            }
            else {
              if (bVar1 != 0x4b) goto LAB_0042169e;
              iVar10 = iVar10 + 2;
            }
          } while (iVar10 <= (int)min + -0x16);
          wVar11 = L'\0';
        }
      }
    }
  }
  return wVar11;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) or Zip64 locator
	 * record (which begins with PK\006\007) */
	tail = zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* TODO: Rework this to search backwards from the end.  We
	 * normally expect the EOCD record to be at the very end, so
	 * that should be significantly faster.  Tricky part: Make
	 * sure we still prefer the Zip64 locator if it's present. */
	for (i = 0; i <= tail - 22;) {
		switch (p[i + 3]) {
		case 'P': i += 3; break;
		case 'K': i += 2; break;
		case 005: i += 1; break;
		case 006:
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i, current_offset + i);
				if (ret > 0)
					return (ret);
			}
			i += 1; /* Look for PK\006\007 next */
			break;
		case 007:
			if (memcmp(p + i, "PK\006\007", 4) == 0) {
				int ret = read_zip64_eocd(a, zip, p + i);
				if (ret > 0)
					return (ret);
			}
			i += 4;
			break;
		default: i += 4; break;
		}
	}
	return 0;
}